

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::CUnescape
          (lts_20250127 *this,string_view source,Nonnull<std::string_*> dest,
          Nullable<std::string_*> error)

{
  lts_20250127 *plVar1;
  lts_20250127 lVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  undefined8 *puVar6;
  lts_20250127 *plVar7;
  AlphaNum *b;
  size_type *psVar8;
  ulong *puVar9;
  lts_20250127 *plVar10;
  uint uVar11;
  char32_t cVar12;
  char32_t utf8_char;
  lts_20250127 *plVar13;
  char *pcVar14;
  _Alloc_hider _Var15;
  lts_20250127 *plVar16;
  lts_20250127 *plVar17;
  lts_20250127 *buffer;
  ulong uVar18;
  undefined1 local_c0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_60;
  lts_20250127 *local_40;
  lts_20250127 *local_38;
  
  puVar9 = (ulong *)source._M_str;
  plVar13 = (lts_20250127 *)source._M_len;
  std::__cxx11::string::resize((ulong)puVar9,(char)this);
  plVar16 = (lts_20250127 *)*puVar9;
  plVar1 = plVar13 + (long)this;
  plVar17 = plVar16;
  plVar7 = plVar13;
  plVar10 = plVar13;
  buffer = plVar16;
  if (0 < (long)this && plVar16 == plVar13) {
    while (plVar10 = plVar7, buffer = plVar17, *plVar7 != (lts_20250127)0x5c) {
      plVar10 = plVar7 + 1;
      buffer = plVar17 + 1;
      if ((plVar7 != plVar17) || (plVar17 = buffer, plVar7 = plVar10, plVar1 <= plVar10)) break;
    }
  }
  if (plVar10 < plVar1) {
    plVar17 = this + (long)plVar13 + -1;
    do {
      if (*plVar10 != (lts_20250127)0x5c) {
        *buffer = *plVar10;
LAB_00ff4386:
        buffer = buffer + 1;
        plVar7 = plVar10;
        goto LAB_00ff452f;
      }
      plVar7 = plVar10 + 1;
      if (plVar17 < plVar7) {
        if (dest == (Nonnull<std::string_*>)0x0) {
          return false;
        }
        std::__cxx11::string::_M_replace((ulong)dest,0,(char *)dest->_M_string_length,0x141c144);
        return false;
      }
      lVar2 = *plVar7;
      if ((byte)lVar2 < 0x55) {
        if ((byte)lVar2 < 0x30) {
          if (lVar2 == (lts_20250127)0x22) {
            *buffer = (lts_20250127)0x22;
          }
          else {
            if (lVar2 != (lts_20250127)0x27) goto switchD_00ff42de_caseD_6f;
            *buffer = (lts_20250127)0x27;
          }
        }
        else {
          uVar3 = (byte)lVar2 - 0x30;
          if (uVar3 < 8) {
            plVar13 = plVar7;
            if ((plVar7 < plVar17) && (((byte)plVar10[2] & 0xf8) == 0x30)) {
              uVar3 = ((uint)(byte)plVar10[2] + uVar3 * 8) - 0x30;
              plVar13 = plVar10 + 2;
            }
            if ((plVar13 < plVar17) && (((byte)plVar13[1] & 0xf8) == 0x30)) {
              uVar3 = ((uint)(byte)plVar13[1] + uVar3 * 8) - 0x30;
              if (0xff < uVar3) {
                if (dest == (Nonnull<std::string_*>)0x0) {
                  return false;
                }
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_60,plVar7,plVar13 + 2);
                puVar6 = (undefined8 *)
                         std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x141c15d);
                local_c0._0_8_ = local_c0 + 0x10;
                psVar8 = puVar6 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar8) {
                  local_c0._16_8_ = *psVar8;
                  local_c0._24_8_ = puVar6[3];
                }
                else {
                  local_c0._16_8_ = *psVar8;
                  local_c0._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar6;
                }
                local_c0._8_8_ = puVar6[1];
                *puVar6 = psVar8;
                puVar6[1] = 0;
                *(undefined1 *)(puVar6 + 2) = 0;
                puVar6 = (undefined8 *)std::__cxx11::string::append(local_c0);
                goto LAB_00ff4735;
              }
              plVar10 = plVar13 + 1;
LAB_00ff4383:
              *buffer = SUB41(uVar3,0);
            }
            else {
              *buffer = SUB41(uVar3,0);
              plVar10 = plVar13;
            }
            goto LAB_00ff4386;
          }
          if (lVar2 != (lts_20250127)0x3f) goto switchD_00ff42de_caseD_6f;
          *buffer = (lts_20250127)0x3f;
        }
        goto LAB_00ff4529;
      }
      if ((byte)lVar2 < 0x62) {
        if ((byte)lVar2 < 0x5c) {
          if (lVar2 == (lts_20250127)0x55) {
            plVar13 = plVar10 + 9;
            if (plVar13 < plVar1) {
              plVar10 = plVar10 + 2;
              b = (AlphaNum *)&DAT_00000008;
              utf8_char = L'\0';
              do {
                cVar12 = utf8_char;
                lVar2 = *plVar10;
                if (-1 < (char)(&ascii_internal::kPropertyBits)[(byte)lVar2]) {
                  if (dest == (Nonnull<std::string_*>)0x0) {
                    return false;
                  }
                  local_c0._0_8_ = local_c0 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0);
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x141c1e0);
                  goto LAB_00ff4684;
                }
                if (0x10fff < (uint)cVar12) {
                  if (dest == (Nonnull<std::string_*>)0x0) {
                    return false;
                  }
                  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_60,plVar7,plVar10 + 1);
                  puVar6 = (undefined8 *)
                           std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x141c15d);
                  local_c0._0_8_ = local_c0 + 0x10;
                  psVar8 = puVar6 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar8) {
                    local_c0._16_8_ = *psVar8;
                    local_c0._24_8_ = puVar6[3];
                  }
                  else {
                    local_c0._16_8_ = *psVar8;
                    local_c0._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*puVar6;
                  }
                  local_c0._8_8_ = puVar6[1];
                  *puVar6 = psVar8;
                  puVar6[1] = 0;
                  *(undefined1 *)(puVar6 + 2) = 0;
                  puVar6 = (undefined8 *)std::__cxx11::string::append(local_c0);
                  goto LAB_00ff4735;
                }
                uVar3 = (byte)lVar2 + 9;
                if ((byte)lVar2 < 0x3a) {
                  uVar3 = (uint)(byte)lVar2;
                }
                utf8_char = cVar12 << 4 | uVar3 & 0xf;
                plVar10 = plVar10 + 1;
                uVar3 = (int)b - 1;
                b = (AlphaNum *)(ulong)uVar3;
              } while (uVar3 != 0);
              uVar3 = cVar12 & 0x1ff80;
              if ((dest == (Nonnull<std::string_*>)0x0) || (uVar3 != 0xd80))
              goto joined_r0x00ff442e;
              local_c0._0_8_ = &DAT_00000009;
              goto LAB_00ff4a98;
            }
            if (dest == (Nonnull<std::string_*>)0x0) {
              return false;
            }
            local_c0._0_8_ = local_c0 + 0x10;
            local_c0._8_8_ = (lts_20250127 *)0x1;
            local_c0[0x11] = 0;
            local_c0[0x10] = *plVar7;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x141c1e0);
            goto LAB_00ff4684;
          }
          if (lVar2 == (lts_20250127)0x58) goto switchD_00ff42de_caseD_78;
          goto switchD_00ff42de_caseD_6f;
        }
        if (lVar2 == (lts_20250127)0x5c) {
          *buffer = (lts_20250127)0x5c;
        }
        else {
          if (lVar2 != (lts_20250127)0x61) goto switchD_00ff42de_caseD_6f;
          *buffer = (lts_20250127)0x7;
        }
        goto LAB_00ff4529;
      }
      switch(lVar2) {
      case (lts_20250127)0x6e:
        *buffer = (lts_20250127)0xa;
        break;
      case (lts_20250127)0x6f:
      case (lts_20250127)0x70:
      case (lts_20250127)0x71:
      case (lts_20250127)0x73:
      case (lts_20250127)0x77:
switchD_00ff42de_caseD_6f:
        if (dest == (Nonnull<std::string_*>)0x0) {
          return false;
        }
        local_c0._0_8_ = local_c0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c0,"Unknown escape sequence: \\","");
        std::operator+(&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,(char)*plVar7);
        std::__cxx11::string::operator=((string *)dest,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_00ff46e0:
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00ff46ed;
      case (lts_20250127)0x72:
        *buffer = (lts_20250127)0xd;
        break;
      case (lts_20250127)0x74:
        *buffer = (lts_20250127)0x9;
        break;
      case (lts_20250127)0x75:
        plVar13 = plVar10 + 5;
        if (plVar13 < plVar1) {
          lVar4 = 0;
          utf8_char = L'\0';
          do {
            cVar12 = utf8_char;
            lVar2 = plVar10[lVar4 + 2];
            if (-1 < (char)(&ascii_internal::kPropertyBits)[(byte)lVar2]) {
              if (dest == (Nonnull<std::string_*>)0x0) {
                return false;
              }
              local_c0._0_8_ = local_c0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_c0,plVar7,plVar10 + lVar4 + 2);
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x141c1b9);
              goto LAB_00ff4684;
            }
            uVar3 = (byte)lVar2 + 9;
            if ((byte)lVar2 < 0x3a) {
              uVar3 = (uint)(byte)lVar2;
            }
            utf8_char = uVar3 & 0xf | cVar12 << 4;
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 4);
          uVar3 = cVar12 & 0xfffff80;
          b = (AlphaNum *)(ulong)uVar3;
          if ((dest != (Nonnull<std::string_*>)0x0) && (uVar3 == 0xd80)) {
            local_c0._0_8_ = &DAT_00000005;
LAB_00ff4a98:
            local_90._M_string_length = 0x141c2c2;
            local_90._M_dataplus._M_p = &DAT_0000002c;
            local_c0._8_8_ = plVar7;
            StrCat_abi_cxx11_(&local_60,(lts_20250127 *)&local_90,(AlphaNum *)local_c0,b);
            std::__cxx11::string::operator=((string *)dest,(string *)&local_60);
            _Var15._M_p = local_60._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p == &local_60.field_2) {
              return false;
            }
            goto LAB_00ff47c4;
          }
joined_r0x00ff442e:
          local_40 = plVar13;
          if (uVar3 == 0xd80) {
            return false;
          }
          local_38 = plVar16;
          sVar5 = strings_internal::EncodeUTF8Char((char *)buffer,utf8_char);
          buffer = buffer + sVar5;
          plVar7 = local_40;
          plVar16 = local_38;
          goto LAB_00ff452f;
        }
        if (dest == (Nonnull<std::string_*>)0x0) {
          return false;
        }
        local_c0._0_8_ = local_c0 + 0x10;
        local_c0._8_8_ = (lts_20250127 *)0x1;
        local_c0[0x11] = 0;
        local_c0[0x10] = *plVar7;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x141c1b9);
LAB_00ff4684:
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_90.field_2._M_allocated_capacity = *psVar8;
          local_90.field_2._8_8_ = puVar6[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar8;
          local_90._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_90._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)dest,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_00ff46e0;
LAB_00ff46ed:
        local_60.field_2._M_allocated_capacity = local_c0._16_8_;
        _Var15._M_p = (pointer)local_c0._0_8_;
        if ((undefined1 *)local_c0._0_8_ == local_c0 + 0x10) {
          return false;
        }
LAB_00ff47c4:
        operator_delete(_Var15._M_p,local_60.field_2._M_allocated_capacity + 1);
        return false;
      case (lts_20250127)0x76:
        *buffer = (lts_20250127)0xb;
        break;
      case (lts_20250127)0x78:
switchD_00ff42de_caseD_78:
        if (plVar17 <= plVar7) {
          if (dest == (Nonnull<std::string_*>)0x0) {
            return false;
          }
          pcVar14 = "String cannot end with \\x";
LAB_00ff4806:
          std::__cxx11::string::operator=((string *)dest,pcVar14);
          return false;
        }
        if (-1 < (char)(&ascii_internal::kPropertyBits)[(byte)plVar10[2]]) {
          if (dest == (Nonnull<std::string_*>)0x0) {
            return false;
          }
          pcVar14 = "\\x cannot be followed by a non-hex digit";
          goto LAB_00ff4806;
        }
        uVar3 = 0;
        plVar10 = plVar7;
        do {
          lVar2 = plVar10[1];
          if (-1 < (char)(&ascii_internal::kPropertyBits)[(byte)lVar2]) break;
          plVar10 = plVar10 + 1;
          uVar11 = (byte)lVar2 + 9;
          if ((byte)lVar2 < 0x3a) {
            uVar11 = (uint)(byte)lVar2;
          }
          uVar3 = uVar3 << 4 | uVar11 & 0xf;
        } while (plVar10 < plVar17);
        if (uVar3 < 0x100) goto LAB_00ff4383;
        if (dest == (Nonnull<std::string_*>)0x0) {
          return false;
        }
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,plVar7,plVar10 + 1);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x141c15d);
        local_c0._0_8_ = local_c0 + 0x10;
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_c0._16_8_ = *psVar8;
          local_c0._24_8_ = puVar6[3];
        }
        else {
          local_c0._16_8_ = *psVar8;
          local_c0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
        }
        local_c0._8_8_ = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append(local_c0);
LAB_00ff4735:
        psVar8 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_90.field_2._M_allocated_capacity = *psVar8;
          local_90.field_2._8_8_ = puVar6[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar8;
          local_90._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_90._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)dest,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
          operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
        }
        _Var15._M_p = local_60._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p == &local_60.field_2) {
          return false;
        }
        goto LAB_00ff47c4;
      default:
        if (lVar2 == (lts_20250127)0x62) {
          *buffer = (lts_20250127)0x8;
        }
        else {
          if (lVar2 != (lts_20250127)0x66) goto switchD_00ff42de_caseD_6f;
          *buffer = (lts_20250127)0xc;
        }
      }
LAB_00ff4529:
      buffer = buffer + 1;
LAB_00ff452f:
      plVar10 = plVar7 + 1;
    } while (plVar10 < plVar1);
  }
  uVar18 = (long)buffer - (long)plVar16;
  if (puVar9[1] < uVar18) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar18
              );
  }
  puVar9[1] = uVar18;
  *(undefined1 *)(*puVar9 + uVar18) = 0;
  return true;
}

Assistant:

bool CUnescape(absl::string_view source, absl::Nonnull<std::string*> dest,
               absl::Nullable<std::string*> error) {
  return CUnescapeInternal(source, kUnescapeNulls, dest, error);
}